

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

uint __thiscall BTree<NodeBTree,_NodeKey>::searchByKey(BTree<NodeBTree,_NodeKey> *this,NodeKey *key)

{
  byte bVar1;
  byte bVar2;
  uint *puVar3;
  byte *data;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  KeyCompareOp in_R9;
  uint uVar8;
  bool bVar9;
  SearchResult result;
  SearchResult local_40;
  
  puVar3 = (uint *)this->m_data;
  bVar1 = (byte)*puVar3;
  uVar8 = *puVar3;
  data = (byte *)((long)puVar3 +
                 (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8));
  local_40.lowerBound = 0;
  local_40.upperBound = 0;
  local_40.index = 0xffffffff;
  local_40.maxIndex = 0;
  bVar9 = bVar1 == 0;
  uVar8 = (uint)bVar1;
  if ((!bVar9) &&
     (data = searchWithComparison(this,&local_40,data,uVar8,key,in_R9), data != (byte *)0x0)) {
    do {
      uVar7 = (ulong)*data;
      pbVar4 = data + 1;
      if ((char)*data < '\0') {
        uVar6 = 0x80;
        do {
          uVar5 = (uVar7 - uVar6) * 0x100;
          bVar2 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          uVar7 = bVar2 | uVar5;
          uVar6 = uVar6 << 7;
        } while ((uVar5 & uVar6) != 0);
      }
      local_40.maxIndex = (uint)uVar7;
      uVar7 = (ulong)*pbVar4;
      if ((char)*pbVar4 < '\0') {
        uVar6 = 0x80;
        do {
          pbVar4 = pbVar4 + 1;
          uVar5 = (uVar7 - uVar6) * 0x100;
          uVar7 = *pbVar4 | uVar5;
          uVar6 = uVar6 << 7;
        } while ((uVar5 & uVar6) != 0);
      }
      data = this->m_data + (uVar7 & 0xffffffff);
      uVar8 = uVar8 - 1;
      bVar9 = uVar8 == 0;
    } while ((!bVar9) &&
            (data = searchWithComparison(this,&local_40,data,(uint)bVar1,key,in_R9),
            data != (byte *)0x0));
  }
  if (bVar9) {
    data = searchWithComparison(this,&local_40,data,0,key,in_R9);
  }
  if (bVar1 == 0) {
    local_40._0_8_ = local_40._0_8_ & 0xffffffff;
  }
  if (data == (byte *)0x0) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = (local_40.maxIndex - local_40.upperBound) + local_40.lowerBound;
    NodeBTree::parseData((NodeBTree *)this,key,data);
  }
  return uVar8;
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}